

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseShow(linenoiseState *l)

{
  linenoiseState *l_local;
  
  if (l->in_completion == 0) {
    refreshLineWithFlags(l,2);
  }
  else {
    refreshLineWithCompletion(l,(linenoiseCompletions *)0x0,2);
  }
  return;
}

Assistant:

void linenoiseShow(struct linenoiseState *l) {
    if (l->in_completion) {
        refreshLineWithCompletion(l,NULL,REFRESH_WRITE);
    } else {
        refreshLineWithFlags(l,REFRESH_WRITE);
    }
}